

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O1

int32_t lj_lib_checkintrange(lua_State *L,int narg,int32_t a,int32_t b)

{
  int iVar1;
  TValue *pTVar2;
  ulong uVar3;
  
  pTVar2 = L->base + (long)narg + -1;
  if (L->top <= pTVar2) goto LAB_0011e5b0;
  uVar3 = pTVar2->it64 >> 0x2f;
  if (uVar3 < 0xfffffffffffffff2) {
    iVar1 = (int)pTVar2->n;
    if ((a <= iVar1) && (iVar1 <= b)) {
      return iVar1;
    }
    goto LAB_0011e5a6;
  }
  if (uVar3 != 0xfffffffffffffff5) goto LAB_0011e5b0;
  uVar3 = pTVar2->it64 & 0x7fffffffffff;
  if (*(short *)(uVar3 + 10) == 0xc) {
    uVar3 = *(ulong *)(uVar3 + 0x10);
    iVar1 = 1;
    if ((ulong)(long)b < uVar3 || uVar3 < (uint)a && -1 < a) {
LAB_0011e590:
      iVar1 = 0;
    }
  }
  else if (*(short *)(uVar3 + 10) == 0xb) {
    uVar3 = *(ulong *)(uVar3 + 0x10);
    iVar1 = 1;
    if ((long)b < (long)uVar3 || (long)uVar3 < (long)a) goto LAB_0011e590;
  }
  else {
    iVar1 = 2;
  }
  if (iVar1 != 2) {
    if (iVar1 != 0) {
      return (int32_t)uVar3;
    }
LAB_0011e5a6:
    lj_err_arg(L,narg,LJ_ERR_NUMRNG);
  }
LAB_0011e5b0:
  lj_err_argt(L,narg,3);
}

Assistant:

int32_t lj_lib_checkintrange(lua_State *L, int narg, int32_t a, int32_t b)
{
  TValue *o = L->base + narg-1;
  lj_assertL(b >= 0, "expected range must be non-negative");
  if (o < L->top) {
    if (LJ_LIKELY(tvisint(o))) {
      int32_t i = intV(o);
      if (i >= a && i <= b) return i;
    } else if (LJ_LIKELY(tvisnum(o))) {
      /* For performance reasons, this doesn't check for integerness or
      ** integer overflow. Overflow detection still works, since all FPUs
      ** return either MININT or MAXINT, which is then out of range.
      */
      int32_t i = (int32_t)numV(o);
      if (i >= a && i <= b) return i;
#if LJ_HASFFI
    } else if (tviscdata(o)) {
      GCcdata *cd = cdataV(o);
      if (cd->ctypeid == CTID_INT64) {
	int64_t i = *(int64_t *)cdataptr(cd);
	if (i >= (int64_t)a && i <= (int64_t)b) return (int32_t)i;
      } else if (cd->ctypeid == CTID_UINT64) {
	uint64_t i = *(uint64_t *)cdataptr(cd);
	if ((a < 0 || i >= (uint64_t)a) && i <= (uint64_t)b) return (int32_t)i;
      } else {
	goto badtype;
      }
#endif
    } else {
      goto badtype;
    }
    lj_err_arg(L, narg, LJ_ERR_NUMRNG);
  }
badtype:
  lj_err_argt(L, narg, LUA_TNUMBER);
  return 0;  /* unreachable */
}